

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencv_demo.cc
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  size_t *__ptr;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  undefined4 *puVar8;
  ostream *poVar9;
  long lVar10;
  char *pcVar11;
  String text;
  Size textsize;
  apriltag_detection_t *det;
  int baseline;
  image_u8_t im;
  VideoCapture cap;
  Mat gray;
  stringstream ss;
  Mat frame;
  _InputArray local_3b8;
  size_t *local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined4 *local_380;
  char *local_378;
  long local_370;
  undefined8 local_368;
  string local_360 [8];
  undefined8 local_358;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  long local_318 [2];
  undefined4 local_308;
  undefined4 local_304;
  undefined4 local_300;
  undefined8 local_2f8;
  undefined4 local_2f0 [2];
  Mat *local_2e8;
  undefined8 local_2e0;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  char local_2c8 [32];
  VideoCapture local_2a8 [48];
  Mat local_278 [8];
  undefined4 local_270;
  undefined4 local_26c;
  undefined8 local_268;
  long *local_218;
  Mat *pMStack_210;
  long local_208 [14];
  ios_base local_198 [264];
  Mat local_90 [96];
  
  uVar6 = getopt_create();
  getopt_add_bool(uVar6,0x68,"help",0,"Show this help");
  getopt_add_bool(uVar6,100,"debug",1,"Enable debugging output (slow)");
  getopt_add_bool(uVar6,0x71,"quiet",0,"Reduce output");
  getopt_add_string(uVar6,0x66,"family","tag36h11","Tag family to use");
  getopt_add_int(uVar6,0x74,"threads","1","Use this many CPU threads");
  getopt_add_double(uVar6,0x78,"decimate","1.0","Decimate input image by this factor");
  getopt_add_double(uVar6,0x62,"blur","0.0","Apply low-pass blur to input");
  pcVar11 = "Spend more time trying to align edges of tags";
  getopt_add_bool(uVar6,0x30,"refine-edges",1);
  iVar4 = getopt_parse(uVar6,argc,argv);
  if (iVar4 != 0) {
    iVar4 = getopt_get_bool(uVar6);
    if (iVar4 == 0) {
      cv::VideoCapture::VideoCapture(local_2a8,0,0);
      cVar3 = cv::VideoCapture::isOpened();
      if (cVar3 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Couldn\'t open video capture device",0x22);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
        std::ostream::put(-0x50);
        iVar4 = -1;
        std::ostream::flush();
      }
      else {
        pcVar7 = (char *)getopt_get_string(uVar6,"family");
        iVar4 = strcmp(pcVar7,"tag36h11");
        if (iVar4 == 0) {
          local_390 = tag36h11_create();
        }
        else {
          iVar4 = strcmp(pcVar7,"tag25h9");
          if (iVar4 == 0) {
            local_390 = tag25h9_create();
          }
          else {
            iVar4 = strcmp(pcVar7,"tag16h5");
            if (iVar4 == 0) {
              local_390 = tag16h5_create();
            }
            else {
              iVar4 = strcmp(pcVar7,"tagCircle21h7");
              if (iVar4 == 0) {
                local_390 = tagCircle21h7_create();
              }
              else {
                iVar4 = strcmp(pcVar7,"tagCircle49h12");
                if (iVar4 == 0) {
                  local_390 = tagCircle49h12_create();
                }
                else {
                  iVar4 = strcmp(pcVar7,"tagStandard41h12");
                  if (iVar4 == 0) {
                    local_390 = tagStandard41h12_create();
                  }
                  else {
                    iVar4 = strcmp(pcVar7,"tagStandard52h13");
                    if (iVar4 != 0) {
                      puts("Unrecognized tag family name. Use e.g. \"tag36h11\".");
                      exit(-1);
                    }
                    local_390 = tagStandard52h13_create();
                  }
                }
              }
            }
          }
        }
        puVar8 = (undefined4 *)apriltag_detector_create();
        apriltag_detector_add_family_bits(puVar8,local_390,2);
        dVar1 = (double)getopt_get_double(uVar6,"decimate");
        puVar8[1] = (float)dVar1;
        dVar1 = (double)getopt_get_double(uVar6,"blur");
        puVar8[2] = (float)dVar1;
        uVar5 = getopt_get_int(uVar6,"threads");
        *puVar8 = uVar5;
        uVar5 = getopt_get_bool(uVar6,"debug");
        puVar8[6] = uVar5;
        uVar5 = getopt_get_bool(uVar6,"refine-edges");
        puVar8[3] = uVar5;
        local_388 = uVar6;
        cv::Mat::Mat(local_90);
        cv::Mat::Mat(local_278);
        local_2d8 = 0;
        uStack_2d4 = 0;
        uStack_2d0 = 0;
        uStack_2cc = 0x406fe000;
        local_380 = puVar8;
        local_378 = pcVar7;
        do {
          puVar8 = local_380;
          cv::VideoCapture::operator>>(local_2a8,local_90);
          local_208[0] = 0;
          local_218 = (long *)CONCAT44(local_218._4_4_,0x1010000);
          local_3b8.sz.width = 0;
          local_3b8.sz.height = 0;
          local_3b8.flags = 0x2010000;
          local_3b8.obj = local_278;
          pMStack_210 = local_90;
          cv::cvtColor((cv *)&local_218,&local_3b8,(_OutputArray *)0x6,0,(int)pcVar11);
          local_308 = local_26c;
          local_304 = local_270;
          local_300 = local_26c;
          local_2f8 = local_268;
          local_398 = (size_t *)apriltag_detector_detect(puVar8,&local_308);
          if (local_398 == (size_t *)0x0) {
            __assert_fail("za != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/./common/zarray.h"
                          ,0x84,"int zarray_size(const zarray_t *)");
          }
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_398[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," tags detected",0xe);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          if (0 < (int)local_398[1]) {
            lVar10 = 0;
            do {
              local_370 = lVar10;
              memcpy(local_318,(void *)(*local_398 * lVar10 + local_398[2]),*local_398);
              lVar10 = local_318[0];
              local_3b8.sz.width = 0;
              local_3b8.sz.height = 0;
              local_3b8.flags = 0x3010000;
              local_320 = CONCAT44((int)*(double *)(local_318[0] + 0x38),
                                   (int)*(double *)(local_318[0] + 0x30));
              local_328 = CONCAT44((int)*(double *)(local_318[0] + 0x48),
                                   (int)*(double *)(local_318[0] + 0x40));
              local_218 = (long *)CONCAT44(uStack_2d4,local_2d8);
              pMStack_210 = (Mat *)CONCAT44(uStack_2cc,uStack_2d0);
              local_208[0] = 0;
              local_208[1] = 0;
              local_3b8.obj = local_90;
              cv::line(&local_3b8,&local_320,&local_328,(cv *)&local_218,2,8,0);
              local_3b8.sz.width = 0;
              local_3b8.sz.height = 0;
              local_3b8.flags = 0x3010000;
              local_330 = CONCAT44((int)*(double *)(lVar10 + 0x38),(int)*(double *)(lVar10 + 0x30));
              local_338 = CONCAT44((int)*(double *)(lVar10 + 0x68),(int)*(double *)(lVar10 + 0x60));
              local_218 = (long *)0x0;
              pMStack_210 = (Mat *)0x0;
              local_208[0] = 0x406fe00000000000;
              local_208[1] = 0;
              local_3b8.obj = local_90;
              cv::line(&local_3b8,&local_330,&local_338,(cv *)&local_218,2,8,0);
              local_3b8.sz.width = 0;
              local_3b8.sz.height = 0;
              local_3b8.flags = 0x3010000;
              local_340 = CONCAT44((int)*(double *)(lVar10 + 0x48),(int)*(double *)(lVar10 + 0x40));
              local_348 = CONCAT44((int)*(double *)(lVar10 + 0x58),(int)*(double *)(lVar10 + 0x50));
              local_218 = (long *)0x406fe00000000000;
              local_208[1] = 0;
              pMStack_210 = (Mat *)0x0;
              local_208[0] = 0;
              local_3b8.obj = local_90;
              cv::line(&local_3b8,&local_340,&local_348,(cv *)&local_218,2,8,0);
              local_3b8.sz.width = 0;
              local_3b8.sz.height = 0;
              local_3b8.flags = 0x3010000;
              local_350 = CONCAT44((int)*(double *)(lVar10 + 0x58),(int)*(double *)(lVar10 + 0x50));
              local_358 = CONCAT44((int)*(double *)(lVar10 + 0x68),(int)*(double *)(lVar10 + 0x60));
              local_218 = (long *)0x406fe00000000000;
              local_208[1] = 0;
              pMStack_210 = (Mat *)0x0;
              local_208[0] = 0;
              local_3b8.obj = local_90;
              cv::line(&local_3b8,&local_350,&local_358,(cv *)&local_218,2,8,0);
              std::__cxx11::stringstream::stringstream((stringstream *)&local_218);
              std::ostream::operator<<((ostream *)local_208,*(int *)(lVar10 + 8));
              std::__cxx11::stringbuf::str();
              cv::getTextSize(local_360,(int)&local_3b8,1.0,6,(int *)0x2);
              local_2e0 = 0;
              local_2f0[0] = 0x3010000;
              local_2e8 = local_90;
              local_368 = CONCAT44((int)(*(double *)(lVar10 + 0x28) + (double)(local_360._4_4_ / 2))
                                   ,(int)(*(double *)(lVar10 + 0x20) - (double)(local_360._0_4_ / 2)
                                         ));
              local_2c8[0] = '\0';
              local_2c8[1] = '\0';
              local_2c8[2] = '\0';
              local_2c8[3] = '\0';
              local_2c8[4] = '\0';
              local_2c8[5] = -0x20;
              local_2c8[6] = 'o';
              local_2c8[7] = '@';
              local_2c8[8] = '\0';
              local_2c8[9] = '\0';
              local_2c8[10] = '\0';
              local_2c8[0xb] = '\0';
              local_2c8[0xc] = '\0';
              local_2c8[0xd] = ' ';
              local_2c8[0xe] = 'c';
              local_2c8[0xf] = '@';
              local_2c8[0x10] = '\0';
              local_2c8[0x11] = '\0';
              local_2c8[0x12] = '\0';
              local_2c8[0x13] = '\0';
              local_2c8[0x14] = '\0';
              local_2c8[0x15] = '\0';
              local_2c8[0x16] = '\0';
              local_2c8[0x17] = '\0';
              local_2c8[0x18] = '\0';
              local_2c8[0x19] = '\0';
              local_2c8[0x1a] = '\0';
              local_2c8[0x1b] = '\0';
              local_2c8[0x1c] = '\0';
              local_2c8[0x1d] = '\0';
              local_2c8[0x1e] = '\0';
              local_2c8[0x1f] = '\0';
              pcVar11 = local_2c8;
              cv::putText(0,local_2f0,&local_3b8,&local_368,6,pcVar11,2,8,0);
              if ((Size *)CONCAT44(local_3b8._4_4_,local_3b8.flags) != &local_3b8.sz) {
                operator_delete((undefined1 *)CONCAT44(local_3b8._4_4_,local_3b8.flags),
                                (long)local_3b8.sz + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)&local_218);
              std::ios_base::~ios_base(local_198);
              lVar10 = local_370 + 1;
            } while (lVar10 < (int)local_398[1]);
          }
          __ptr = local_398;
          if ((void *)local_398[2] != (void *)0x0) {
            free((void *)local_398[2]);
          }
          free(__ptr);
          local_218 = local_208;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Tag Detections","");
          pcVar7 = local_378;
          local_3b8.sz.width = 0;
          local_3b8.sz.height = 0;
          local_3b8.flags = 0x1010000;
          local_3b8.obj = local_90;
          cv::imshow((string *)&local_218,&local_3b8);
          if (local_218 != local_208) {
            operator_delete(local_218,local_208[0] + 1);
          }
          iVar4 = cv::waitKey(0x1e);
        } while (iVar4 < 0);
        apriltag_detector_destroy(local_380);
        uVar2 = local_388;
        uVar6 = local_390;
        iVar4 = strcmp(pcVar7,"tag36h11");
        if (iVar4 == 0) {
          tag36h11_destroy(uVar6);
        }
        else {
          iVar4 = strcmp(pcVar7,"tag25h9");
          if (iVar4 == 0) {
            tag25h9_destroy(uVar6);
          }
          else {
            iVar4 = strcmp(pcVar7,"tag16h5");
            if (iVar4 == 0) {
              tag16h5_destroy(uVar6);
            }
            else {
              iVar4 = strcmp(pcVar7,"tagCircle21h7");
              if (iVar4 == 0) {
                tagCircle21h7_destroy(uVar6);
              }
              else {
                iVar4 = strcmp(pcVar7,"tagCircle49h12");
                if (iVar4 == 0) {
                  tagCircle49h12_destroy(uVar6);
                }
                else {
                  iVar4 = strcmp(pcVar7,"tagStandard41h12");
                  if (iVar4 == 0) {
                    tagStandard41h12_destroy(uVar6);
                  }
                  else {
                    iVar4 = strcmp(pcVar7,"tagStandard52h13");
                    if (iVar4 == 0) {
                      tagStandard52h13_destroy(uVar6);
                    }
                  }
                }
              }
            }
          }
        }
        getopt_destroy(uVar2);
        cv::Mat::~Mat(local_278);
        cv::Mat::~Mat(local_90);
        iVar4 = 0;
      }
      cv::VideoCapture::~VideoCapture(local_2a8);
      return iVar4;
    }
  }
  printf("Usage: %s [options]\n",*argv);
  getopt_do_usage();
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    getopt_t *getopt = getopt_create();

    getopt_add_bool(getopt, 'h', "help", 0, "Show this help");
    getopt_add_bool(getopt, 'd', "debug", 1, "Enable debugging output (slow)");
    getopt_add_bool(getopt, 'q', "quiet", 0, "Reduce output");
    getopt_add_string(getopt, 'f', "family", "tag36h11", "Tag family to use");
    getopt_add_int(getopt, 't', "threads", "1", "Use this many CPU threads");
    getopt_add_double(getopt, 'x', "decimate", "1.0", "Decimate input image by this factor");
    getopt_add_double(getopt, 'b', "blur", "0.0", "Apply low-pass blur to input");
    getopt_add_bool(getopt, '0', "refine-edges", 1, "Spend more time trying to align edges of tags");

    if (!getopt_parse(getopt, argc, argv, 1) ||
            getopt_get_bool(getopt, "help")) {
        printf("Usage: %s [options]\n", argv[0]);
        getopt_do_usage(getopt);
        exit(0);
    }

    // Initialize camera
    VideoCapture cap(0);
    if (!cap.isOpened()) {
        cerr << "Couldn't open video capture device" << endl;
        return -1;
    }

    // Initialize tag detector with options
    apriltag_family_t *tf = NULL;
    const char *famname = getopt_get_string(getopt, "family");
    if (!strcmp(famname, "tag36h11")) {
        tf = tag36h11_create();
    } else if (!strcmp(famname, "tag25h9")) {
        tf = tag25h9_create();
    } else if (!strcmp(famname, "tag16h5")) {
        tf = tag16h5_create();
    } else if (!strcmp(famname, "tagCircle21h7")) {
        tf = tagCircle21h7_create();
    } else if (!strcmp(famname, "tagCircle49h12")) {
        tf = tagCircle49h12_create();
    } else if (!strcmp(famname, "tagStandard41h12")) {
        tf = tagStandard41h12_create();
    } else if (!strcmp(famname, "tagStandard52h13")) {
        tf = tagStandard52h13_create();
    } else {
        printf("Unrecognized tag family name. Use e.g. \"tag36h11\".\n");
        exit(-1);
    }


    apriltag_detector_t *td = apriltag_detector_create();
    apriltag_detector_add_family(td, tf);
    td->quad_decimate = getopt_get_double(getopt, "decimate");
    td->quad_sigma = getopt_get_double(getopt, "blur");
    td->nthreads = getopt_get_int(getopt, "threads");
    td->debug = getopt_get_bool(getopt, "debug");
    td->refine_edges = getopt_get_bool(getopt, "refine-edges");

    Mat frame, gray;
    while (true) {
        cap >> frame;
        cvtColor(frame, gray, COLOR_BGR2GRAY);

        // Make an image_u8_t header for the Mat data
        image_u8_t im = { .width = gray.cols,
            .height = gray.rows,
            .stride = gray.cols,
            .buf = gray.data
        };

        zarray_t *detections = apriltag_detector_detect(td, &im);
        cout << zarray_size(detections) << " tags detected" << endl;

        // Draw detection outlines
        for (int i = 0; i < zarray_size(detections); i++) {
            apriltag_detection_t *det;
            zarray_get(detections, i, &det);
            line(frame, Point(det->p[0][0], det->p[0][1]),
                     Point(det->p[1][0], det->p[1][1]),
                     Scalar(0, 0xff, 0), 2);
            line(frame, Point(det->p[0][0], det->p[0][1]),
                     Point(det->p[3][0], det->p[3][1]),
                     Scalar(0, 0, 0xff), 2);
            line(frame, Point(det->p[1][0], det->p[1][1]),
                     Point(det->p[2][0], det->p[2][1]),
                     Scalar(0xff, 0, 0), 2);
            line(frame, Point(det->p[2][0], det->p[2][1]),
                     Point(det->p[3][0], det->p[3][1]),
                     Scalar(0xff, 0, 0), 2);

            stringstream ss;
            ss << det->id;
            String text = ss.str();
            int fontface = FONT_HERSHEY_SCRIPT_SIMPLEX;
            double fontscale = 1.0;
            int baseline;
            Size textsize = getTextSize(text, fontface, fontscale, 2,
                                            &baseline);
            putText(frame, text, Point(det->c[0]-textsize.width/2,
                                       det->c[1]+textsize.height/2),
                    fontface, fontscale, Scalar(0xff, 0x99, 0), 2);
        }
        zarray_destroy(detections);

        imshow("Tag Detections", frame);
        if (waitKey(30) >= 0)
            break;
    }

    apriltag_detector_destroy(td);

    if (!strcmp(famname, "tag36h11")) {
        tag36h11_destroy(tf);
    } else if (!strcmp(famname, "tag25h9")) {
        tag25h9_destroy(tf);
    } else if (!strcmp(famname, "tag16h5")) {
        tag16h5_destroy(tf);
    } else if (!strcmp(famname, "tagCircle21h7")) {
        tagCircle21h7_destroy(tf);
    } else if (!strcmp(famname, "tagCircle49h12")) {
        tagCircle49h12_destroy(tf);
    } else if (!strcmp(famname, "tagStandard41h12")) {
        tagStandard41h12_destroy(tf);
    } else if (!strcmp(famname, "tagStandard52h13")) {
        tagStandard52h13_destroy(tf);
    }


    getopt_destroy(getopt);

    return 0;
}